

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator_mq.c
# Opt level: O1

void validator_mq_finish(_Bool unlink,mqd_t validator_mq,_Bool *err)

{
  int iVar1;
  undefined7 in_register_00000039;
  
  iVar1 = mq_close(validator_mq);
  if ((int)CONCAT71(in_register_00000039,unlink) != 0) {
    iVar1 = mq_unlink("/pw_validator_validator_mq_single");
  }
  if (iVar1 != -1) {
    return;
  }
  if (err != (_Bool *)0x0) {
    *err = true;
  }
  log_formatted("Fail in %s, function: %s",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/src/validator_mq.c"
                ,"validator_mq_finish");
  return;
}

Assistant:

void validator_mq_finish(bool unlink, mqd_t validator_mq, bool *err) {
    assert(err != NULL);

    int tmp_err = 0;

    tmp_err = mq_close(validator_mq);
    if(unlink) {
        // intentionally performed before error checking to efficiently free resources in case of error
        tmp_err = mq_unlink(VALIDATOR_MQ_NAME);
    }
    VOID_FAIL_IF(tmp_err == -1);
}